

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall
cmMakefile::AddIncludeDirectories
          (cmMakefile *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *incs,bool before)

{
  __node_base *p_Var1;
  string entryString;
  cmListFileBacktrace lfbt;
  string sStack_88;
  cmListFileBacktrace local_68;
  cmStateDirectory local_48;
  
  if ((incs->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (incs->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    cmListFileBacktrace::cmListFileBacktrace(&local_68,&this->Backtrace);
    cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&sStack_88,incs,";");
    if (before) {
      cmStateSnapshot::GetDirectory(&local_48,&this->StateSnapshot);
      cmStateDirectory::PrependIncludeDirectoriesEntry(&local_48,&sStack_88,&local_68);
    }
    else {
      cmStateSnapshot::GetDirectory(&local_48,&this->StateSnapshot);
      cmStateDirectory::AppendIncludeDirectoriesEntry(&local_48,&sStack_88,&local_68);
    }
    p_Var1 = &(this->Targets)._M_h._M_before_begin;
    while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
      cmTarget::InsertInclude((cmTarget *)(p_Var1 + 5),&sStack_88,&local_68,before);
    }
    std::__cxx11::string::~string((string *)&sStack_88);
    cmListFileBacktrace::~cmListFileBacktrace(&local_68);
  }
  return;
}

Assistant:

cmTarget* cmMakefile::AddUtilityCommand(
  const std::string& utilityName, bool excludeFromAll,
  const char* workingDirectory, const std::vector<std::string>& depends,
  const cmCustomCommandLines& commandLines, bool escapeOldStyle,
  const char* comment, bool uses_terminal, bool command_expand_lists)
{
  std::vector<std::string> no_byproducts;
  return this->AddUtilityCommand(utilityName, excludeFromAll, workingDirectory,
                                 no_byproducts, depends, commandLines,
                                 escapeOldStyle, comment, uses_terminal,
                                 command_expand_lists);
}